

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_fspic.cpp
# Opt level: O1

void __thiscall
DHUDPicManager::DoDraw(DHUDPicManager *this,int linenum,int x,int y,int hudheight,float translucent)

{
  uint uVar1;
  FHudPic *pFVar2;
  FTexture *img;
  long lVar3;
  ulong uVar4;
  
  if ((this->piclist).Count != 0) {
    lVar3 = 0xc;
    uVar4 = 0;
    do {
      pFVar2 = (this->piclist).Array;
      uVar1 = *(uint *)((long)pFVar2 + lVar3 + -0xc);
      if ((0 < (long)(int)uVar1) &&
         (*(char *)((long)&(pFVar2->texturenum).texnum + lVar3) == '\x01')) {
        if (uVar1 < TexMan.Textures.Count) {
          img = TexMan.Textures.Array[(int)uVar1].Texture;
        }
        else {
          img = (FTexture *)0x0;
        }
        if (img != (FTexture *)0x0) {
          DCanvas::DrawTexture
                    ((DCanvas *)screen,img,(double)*(int *)((long)pFVar2 + lVar3 + -8),
                     (double)*(int *)((long)pFVar2 + lVar3 + -4),0x40001391,
                     (double)(this->basetrans * translucent),1,0x4000138c,0);
        }
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x10;
    } while (uVar4 < (this->piclist).Count);
  }
  return;
}

Assistant:

void DHUDPicManager::DoDraw (int linenum, int x, int y, int hudheight, float translucent)
{
	for(unsigned int i=0; i<piclist.Size();i++) if (piclist[i].texturenum.isValid() && piclist[i].draw)
	{
		FTexture * tex = TexMan[piclist[i].texturenum];
		if (tex) screen->DrawTexture(tex, piclist[i].xpos, piclist[i].ypos, DTA_320x200, true, 
										DTA_AlphaF, translucent*basetrans, TAG_DONE);
	}
}